

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O2

void __thiscall uint256_tests::comparison::test_method(comparison *this)

{
  uchar *puVar1;
  long lVar2;
  int i;
  uint uVar3;
  int i_1;
  iterator in_R8;
  iterator pvVar4;
  uint256 *in_R9;
  undefined1 *puVar5;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 local_d8;
  undefined8 local_d7;
  undefined7 uStack_cf;
  undefined1 uStack_c8;
  undefined7 uStack_c7;
  undefined8 uStack_c0;
  uint160 LastS;
  uint160 TmpS;
  uint256 TmpL;
  uint256 LastL;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  LastL.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  LastL.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  for (uVar3 = 0xff; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    TmpL.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    TmpL.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    puVar1 = TmpL.super_base_blob<256U>.m_data._M_elems + (uVar3 >> 3);
    *puVar1 = *puVar1 | (byte)(1 << (~(byte)uVar3 & 7));
    local_e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_e0 = "";
    local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = (iterator)in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x72;
    file.m_begin = (iterator)&local_e8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f8,msg);
    TmpS.super_base_blob<160U>.m_data._M_elems[8] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
    TmpS.super_base_blob<160U>.m_data._M_elems[0x10] = '@';
    TmpS.super_base_blob<160U>.m_data._M_elems[0x11] = 0xe1;
    TmpS.super_base_blob<160U>.m_data._M_elems[0x12] = '\x14';
    TmpS.super_base_blob<160U>.m_data._M_elems[0x13] = '\x01';
    local_108 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_100 = "";
    in_R8 = (iterator)0x4;
    in_R9 = &LastL;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint256,uint256>
              (&TmpS,&local_108,0x72,1,4,in_R9,"LastL",&TmpL,"TmpL");
    LastL.super_base_blob<256U>.m_data._M_elems[0] = TmpL.super_base_blob<256U>.m_data._M_elems[0];
    LastL.super_base_blob<256U>.m_data._M_elems[1] = TmpL.super_base_blob<256U>.m_data._M_elems[1];
    LastL.super_base_blob<256U>.m_data._M_elems[2] = TmpL.super_base_blob<256U>.m_data._M_elems[2];
    LastL.super_base_blob<256U>.m_data._M_elems[3] = TmpL.super_base_blob<256U>.m_data._M_elems[3];
    LastL.super_base_blob<256U>.m_data._M_elems[4] = TmpL.super_base_blob<256U>.m_data._M_elems[4];
    LastL.super_base_blob<256U>.m_data._M_elems[5] = TmpL.super_base_blob<256U>.m_data._M_elems[5];
    LastL.super_base_blob<256U>.m_data._M_elems[6] = TmpL.super_base_blob<256U>.m_data._M_elems[6];
    LastL.super_base_blob<256U>.m_data._M_elems[7] = TmpL.super_base_blob<256U>.m_data._M_elems[7];
    LastL.super_base_blob<256U>.m_data._M_elems[8] = TmpL.super_base_blob<256U>.m_data._M_elems[8];
    LastL.super_base_blob<256U>.m_data._M_elems[9] = TmpL.super_base_blob<256U>.m_data._M_elems[9];
    LastL.super_base_blob<256U>.m_data._M_elems[10] = TmpL.super_base_blob<256U>.m_data._M_elems[10]
    ;
    LastL.super_base_blob<256U>.m_data._M_elems[0xb] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0xb];
    LastL.super_base_blob<256U>.m_data._M_elems[0xc] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0xc];
    LastL.super_base_blob<256U>.m_data._M_elems[0xd] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0xd];
    LastL.super_base_blob<256U>.m_data._M_elems[0xe] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0xe];
    LastL.super_base_blob<256U>.m_data._M_elems[0xf] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0xf];
    LastL.super_base_blob<256U>.m_data._M_elems[0x10] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x10];
    LastL.super_base_blob<256U>.m_data._M_elems[0x11] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x11];
    LastL.super_base_blob<256U>.m_data._M_elems[0x12] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x12];
    LastL.super_base_blob<256U>.m_data._M_elems[0x13] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x13];
    LastL.super_base_blob<256U>.m_data._M_elems[0x14] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x14];
    LastL.super_base_blob<256U>.m_data._M_elems[0x15] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x15];
    LastL.super_base_blob<256U>.m_data._M_elems[0x16] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x16];
    LastL.super_base_blob<256U>.m_data._M_elems[0x17] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x17];
    LastL.super_base_blob<256U>.m_data._M_elems[0x18] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x18];
    LastL.super_base_blob<256U>.m_data._M_elems[0x19] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x19];
    LastL.super_base_blob<256U>.m_data._M_elems[0x1a] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x1a];
    LastL.super_base_blob<256U>.m_data._M_elems[0x1b] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x1b];
    LastL.super_base_blob<256U>.m_data._M_elems[0x1c] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x1c];
    LastL.super_base_blob<256U>.m_data._M_elems[0x1d] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x1d];
    LastL.super_base_blob<256U>.m_data._M_elems[0x1e] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x1e];
    LastL.super_base_blob<256U>.m_data._M_elems[0x1f] =
         TmpL.super_base_blob<256U>.m_data._M_elems[0x1f];
  }
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0x76;
  file_00.m_begin = (iterator)&local_118;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_128,
             msg_00);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_130 = "";
  puVar5 = ZeroL;
  pvVar4 = (iterator)0x4;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint256,uint256>
            (&TmpL,&local_138,0x76,1,4,ZeroL,"ZeroL",R1L,"R1L");
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = puVar5;
  msg_01.m_begin = pvVar4;
  file_01.m_end = (iterator)0x77;
  file_01.m_begin = (iterator)&local_148;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_158,
             msg_01);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_160 = "";
  puVar5 = R2L;
  pvVar4 = (iterator)0x4;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint256,uint256>
            (&TmpL,&local_168,0x77,1,4,R2L,"R2L",R1L,"R1L");
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = puVar5;
  msg_02.m_begin = pvVar4;
  file_02.m_end = (iterator)0x78;
  file_02.m_begin = (iterator)&local_178;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_188,
             msg_02);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_190 = "";
  pvVar4 = (iterator)0x4;
  puVar5 = ZeroL;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint256,uint256>
            (&TmpL,&local_198,0x78,1,4,ZeroL,"ZeroL",OneL,"OneL");
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = puVar5;
  msg_03.m_begin = pvVar4;
  file_03.m_end = (iterator)0x79;
  file_03.m_begin = (iterator)&local_1a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1b8,
             msg_03);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1c0 = "";
  pvVar4 = (iterator)0x4;
  puVar5 = OneL;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint256,uint256>
            (&TmpL,&local_1c8,0x79,1,4,OneL,"OneL",MaxL,"MaxL");
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = puVar5;
  msg_04.m_begin = pvVar4;
  file_04.m_end = (iterator)0x7a;
  file_04.m_begin = (iterator)&local_1d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1e8,
             msg_04);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1f0 = "";
  pvVar4 = (iterator)0x4;
  puVar5 = R1L;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint256,uint256>
            (&TmpL,&local_1f8,0x7a,1,4,R1L,"R1L",MaxL,"MaxL");
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = puVar5;
  msg_05.m_begin = pvVar4;
  file_05.m_end = (iterator)0x7b;
  file_05.m_begin = (iterator)&local_208;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_218,
             msg_05);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_220 = "";
  pvVar4 = (iterator)0x4;
  puVar5 = R2L;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint256,uint256>
            (&TmpL,&local_228,0x7b,1,4,R2L,"R2L",MaxL,"MaxL");
  LastS.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  LastS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  for (uVar3 = 0x9f; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    TmpS.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[1] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[2] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[8] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[9] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[10] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
    TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
    puVar1 = TmpS.super_base_blob<160U>.m_data._M_elems + (uVar3 >> 3);
    *puVar1 = *puVar1 | (byte)(1 << (~(byte)uVar3 & 7));
    local_238 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_230 = "";
    local_248 = &boost::unit_test::basic_cstring<char_const>::null;
    local_240 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_06.m_end = puVar5;
    msg_06.m_begin = pvVar4;
    file_06.m_end = (iterator)0x81;
    file_06.m_begin = (iterator)&local_238;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_248,
               msg_06);
    TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
         TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
    TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
    TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_258 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_250 = "";
    pvVar4 = (iterator)0x4;
    puVar5 = (undefined1 *)&LastS;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint160,uint160>
              (&TmpL,&local_258,0x81,1,4,puVar5,"LastS",&TmpS,"TmpS");
    LastS.super_base_blob<160U>.m_data._M_elems[0] = TmpS.super_base_blob<160U>.m_data._M_elems[0];
    LastS.super_base_blob<160U>.m_data._M_elems[1] = TmpS.super_base_blob<160U>.m_data._M_elems[1];
    LastS.super_base_blob<160U>.m_data._M_elems[2] = TmpS.super_base_blob<160U>.m_data._M_elems[2];
    LastS.super_base_blob<160U>.m_data._M_elems[3] = TmpS.super_base_blob<160U>.m_data._M_elems[3];
    LastS.super_base_blob<160U>.m_data._M_elems[4] = TmpS.super_base_blob<160U>.m_data._M_elems[4];
    LastS.super_base_blob<160U>.m_data._M_elems[5] = TmpS.super_base_blob<160U>.m_data._M_elems[5];
    LastS.super_base_blob<160U>.m_data._M_elems[6] = TmpS.super_base_blob<160U>.m_data._M_elems[6];
    LastS.super_base_blob<160U>.m_data._M_elems[7] = TmpS.super_base_blob<160U>.m_data._M_elems[7];
    LastS.super_base_blob<160U>.m_data._M_elems[9] = TmpS.super_base_blob<160U>.m_data._M_elems[9];
    LastS.super_base_blob<160U>.m_data._M_elems[10] = TmpS.super_base_blob<160U>.m_data._M_elems[10]
    ;
    LastS.super_base_blob<160U>.m_data._M_elems[0xb] =
         TmpS.super_base_blob<160U>.m_data._M_elems[0xb];
    LastS.super_base_blob<160U>.m_data._M_elems[0xc] =
         TmpS.super_base_blob<160U>.m_data._M_elems[0xc];
    LastS.super_base_blob<160U>.m_data._M_elems[0xd] =
         TmpS.super_base_blob<160U>.m_data._M_elems[0xd];
    LastS.super_base_blob<160U>.m_data._M_elems[0xe] =
         TmpS.super_base_blob<160U>.m_data._M_elems[0xe];
    LastS.super_base_blob<160U>.m_data._M_elems[8] = TmpS.super_base_blob<160U>.m_data._M_elems[8];
    LastS.super_base_blob<160U>.m_data._M_elems[0xf] =
         TmpS.super_base_blob<160U>.m_data._M_elems[0xf];
    LastS.super_base_blob<160U>.m_data._M_elems[0x10] =
         TmpS.super_base_blob<160U>.m_data._M_elems[0x10];
    LastS.super_base_blob<160U>.m_data._M_elems[0x11] =
         TmpS.super_base_blob<160U>.m_data._M_elems[0x11];
    LastS.super_base_blob<160U>.m_data._M_elems[0x12] =
         TmpS.super_base_blob<160U>.m_data._M_elems[0x12];
    LastS.super_base_blob<160U>.m_data._M_elems[0x13] =
         TmpS.super_base_blob<160U>.m_data._M_elems[0x13];
  }
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = puVar5;
  msg_07.m_begin = pvVar4;
  file_07.m_end = (iterator)0x84;
  file_07.m_begin = (iterator)&local_268;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_278,
             msg_07);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_280 = "";
  puVar5 = ZeroS;
  pvVar4 = (iterator)0x4;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint160,uint160>
            (&TmpL,&local_288,0x84,1,4,ZeroS,"ZeroS",R1S,"R1S");
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = puVar5;
  msg_08.m_begin = pvVar4;
  file_08.m_end = (iterator)0x85;
  file_08.m_begin = (iterator)&local_298;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2a8,
             msg_08);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2b0 = "";
  puVar5 = R2S;
  pvVar4 = (iterator)0x4;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint160,uint160>
            (&TmpL,&local_2b8,0x85,1,4,R2S,"R2S",R1S,"R1S");
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = puVar5;
  msg_09.m_begin = pvVar4;
  file_09.m_end = (iterator)0x86;
  file_09.m_begin = (iterator)&local_2c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2d8,
             msg_09);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2e0 = "";
  pvVar4 = (iterator)0x4;
  puVar5 = ZeroS;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint160,uint160>
            (&TmpL,&local_2e8,0x86,1,4,ZeroS,"ZeroS",OneS,"OneS");
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = puVar5;
  msg_10.m_begin = pvVar4;
  file_10.m_end = (iterator)0x87;
  file_10.m_begin = (iterator)&local_2f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_308,
             msg_10);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_310 = "";
  pvVar4 = (iterator)0x4;
  puVar5 = OneS;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint160,uint160>
            (&TmpL,&local_318,0x87,1,4,OneS,"OneS",MaxS,"MaxS");
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = puVar5;
  msg_11.m_begin = pvVar4;
  file_11.m_end = (iterator)0x88;
  file_11.m_begin = (iterator)&local_328;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_338,
             msg_11);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_340 = "";
  pvVar4 = (iterator)0x4;
  puVar5 = R1S;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint160,uint160>
            (&TmpL,&local_348,0x88,1,4,R1S,"R1S",MaxS,"MaxS");
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = puVar5;
  msg_12.m_begin = pvVar4;
  file_12.m_end = (iterator)0x89;
  file_12.m_begin = (iterator)&local_358;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_368,
             msg_12);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_370 = "";
  pvVar4 = (iterator)0x4;
  puVar5 = R2S;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint160,uint160>
            (&TmpL,&local_378,0x89,1,4,R2S,"R2S",MaxS,"MaxS");
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = puVar5;
  msg_13.m_begin = pvVar4;
  file_13.m_end = (iterator)0x8c;
  file_13.m_begin = (iterator)&local_388;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_398,
             msg_13);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_3a0 = "";
  puVar5 = R2L;
  pvVar4 = (iterator)0x4;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint256,uint256>
            (&TmpL,&local_3a8,0x8c,1,4,R2L,"R2L",R1L,"R1L");
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = puVar5;
  msg_14.m_begin = pvVar4;
  file_14.m_end = (iterator)0x8e;
  file_14.m_begin = (iterator)&local_3b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_3c8,
             msg_14);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_3d0 = "";
  pvVar4 = (iterator)0x4;
  puVar5 = R2L;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::lt_impl,unsigned_char,unsigned_char>
            (&TmpL,&local_3d8,0x8e,1,4,R2L,"*R2L.begin()",R1L,"*R1L.begin()");
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = puVar5;
  msg_15.m_begin = pvVar4;
  file_15.m_end = (iterator)0x90;
  file_15.m_begin = (iterator)&local_3e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_3f8,
             msg_15);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_400 = "";
  pvVar6 = R1L + 0x1f;
  pvVar4 = (iterator)0x4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::lt_impl,unsigned_char,unsigned_char>
            (&TmpL,&local_408,0x90,1,4,0x1153528,"*(R1L.end()-1)",0x115355c,"*(R2L.end()-1)");
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = pvVar6;
  msg_16.m_begin = pvVar4;
  file_16.m_end = (iterator)0x93;
  file_16.m_begin = (iterator)&local_418;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_428,
             msg_16);
  TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ =
       TmpL.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  TmpL.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  TmpL.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  TmpL.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_430 = "";
  TmpS.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  TmpS.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_d8 = 1;
  local_d7 = 0;
  uStack_cf = 0;
  uStack_c8 = 0;
  uStack_c7 = 0;
  uStack_c0 = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,uint256,uint256>
            (&TmpL,&local_438,0x93,1,4,&TmpS,
             "uint256{\"1000000000000000000000000000000000000000000000000000000000000000\"}",
             &local_d8,
             "uint256{\"0000000000000000000000000000000000000000000000000000000000000001\"}");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE( comparison ) // <= >= < >
{
    uint256 LastL;
    for (int i = 255; i >= 0; --i) {
        uint256 TmpL;
        *(TmpL.begin() + (i>>3)) |= 1<<(7-(i&7));
        BOOST_CHECK_LT(LastL, TmpL);
        LastL = TmpL;
    }

    BOOST_CHECK_LT(ZeroL, R1L);
    BOOST_CHECK_LT(R2L, R1L);
    BOOST_CHECK_LT(ZeroL, OneL);
    BOOST_CHECK_LT(OneL, MaxL);
    BOOST_CHECK_LT(R1L, MaxL);
    BOOST_CHECK_LT(R2L, MaxL);

    uint160 LastS;
    for (int i = 159; i >= 0; --i) {
        uint160 TmpS;
        *(TmpS.begin() + (i>>3)) |= 1<<(7-(i&7));
        BOOST_CHECK_LT(LastS, TmpS);
        LastS = TmpS;
    }
    BOOST_CHECK_LT(ZeroS, R1S);
    BOOST_CHECK_LT(R2S, R1S);
    BOOST_CHECK_LT(ZeroS, OneS);
    BOOST_CHECK_LT(OneS, MaxS);
    BOOST_CHECK_LT(R1S, MaxS);
    BOOST_CHECK_LT(R2S, MaxS);

    // Non-arithmetic uint256s compare from the beginning of their inner arrays:
    BOOST_CHECK_LT(R2L, R1L);
    // Ensure first element comparisons give the same order as above:
    BOOST_CHECK_LT(*R2L.begin(), *R1L.begin());
    // Ensure last element comparisons give a different result (swapped params):
    BOOST_CHECK_LT(*(R1L.end()-1), *(R2L.end()-1));
    // Hex strings represent reverse-encoded bytes, with lexicographic ordering:
    BOOST_CHECK_LT(uint256{"1000000000000000000000000000000000000000000000000000000000000000"},
                   uint256{"0000000000000000000000000000000000000000000000000000000000000001"});
}